

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_add_handle(CURLM *m,CURL *d)

{
  uint uVar1;
  long lVar2;
  _Bool _Var3;
  CURLMcode CVar4;
  CURLMcode CVar5;
  uint uVar6;
  uint uVar7;
  CURLM *pCVar8;
  
  CVar5 = CURLM_BAD_HANDLE;
  if ((((m != (CURLM *)0x0) && (*m == 0xbab1e)) && (CVar5 = CURLM_BAD_EASY_HANDLE, d != (CURL *)0x0)
      ) && ((*d == -0x3f212453 && (CVar5 = CURLM_ADDED_ALREADY, *(long *)((long)d + 0x68) == 0)))) {
    CVar5 = CURLM_RECURSIVE_API_CALL;
    if ((*(byte *)((long)m + 0x271) & 4) == 0) {
      if ((*(byte *)((long)m + 0x271) & 0x10) != 0) {
        uVar6 = Curl_uint_tbl_count((uint_tbl *)((long)m + 8));
        if (uVar6 != 1) {
          return CURLM_ABORTED_BY_CALLBACK;
        }
        _Var3 = Curl_uint_tbl_contains((uint_tbl *)((long)m + 8),0);
        if (!_Var3) {
          return CURLM_ABORTED_BY_CALLBACK;
        }
        *(byte *)((long)m + 0x271) = *(byte *)((long)m + 0x271) & 0xef;
        Curl_uint_bset_clear((uint_bset *)((long)m + 0x28));
        Curl_uint_bset_clear((uint_bset *)((long)m + 0x38));
        Curl_uint_bset_clear((uint_bset *)((long)m + 0x48));
      }
      if (*(CURLM **)((long)d + 0x70) != (CURLM *)0x0) {
        curl_multi_cleanup(*(CURLM **)((long)d + 0x70));
        *(undefined8 *)((long)d + 0x70) = 0;
      }
      CVar4 = multi_xfers_add((Curl_multi *)m,(Curl_easy *)d);
      CVar5 = CURLM_OUT_OF_MEMORY;
      if (CVar4 == CURLM_OK) {
        Curl_llist_init((Curl_llist *)((long)d + 0xdd8),(Curl_llist_dtor)0x0);
        if (*(undefined1 **)((long)d + 0x1a0) != (undefined1 *)0x0) {
          **(undefined1 **)((long)d + 0x1a0) = 0;
        }
        *(undefined4 *)((long)d + 0xc64) = 0;
        *(CURLM **)((long)d + 0x68) = m;
        Curl_expire((Curl_easy *)d,0,EXPIRE_RUN_NOW);
        CVar5 = Curl_update_timer((Curl_multi *)m);
        if (CVar5 == CURLM_OK) {
          mstate((Curl_easy *)d,MSTATE_INIT);
          pCVar8 = *(CURLM **)((long)d + 0x78);
          if ((pCVar8 == (CURLM *)0x0) || ((*(byte *)((long)pCVar8 + 4) & 0x40) == 0)) {
            pCVar8 = m;
          }
          *(long *)((long)d + 0xb0) = (long)pCVar8 + 0xd8;
          Curl_uint_bset_add((uint_bset *)((long)m + 0x28),*(uint *)((long)d + 0x10));
          *(int *)((long)m + 4) = *(int *)((long)m + 4) + 1;
          Curl_cpool_xfer_init((Curl_easy *)d);
          lVar2 = *(long *)((long)m + 0x78);
          *(undefined4 *)(lVar2 + 0x9b8) = *(undefined4 *)((long)d + 0x9b8);
          *(undefined4 *)(lVar2 + 0x9c4) = *(undefined4 *)((long)d + 0x9c4);
          *(ulong *)(lVar2 + 0xa2c) =
               *(ulong *)(lVar2 + 0xa2c) & 0xfffffffdffffffff |
               *(ulong *)((long)d + 0xa2c) & 0x200000000;
          CVar5 = CURLM_OK;
          if (((*(byte *)((long)d + 0xa2f) & 0x40) != 0) &&
             (((*(long *)((long)d + 0x1310) == 0 || (0 < *(int *)(*(long *)((long)d + 0x1310) + 8)))
              && (CVar5 = CURLM_OK, 0 < Curl_trc_feat_multi.log_level)))) {
            uVar6 = *(uint *)((long)d + 0x10);
            uVar1 = *(uint *)((long)m + 4);
            uVar7 = Curl_uint_tbl_count((uint_tbl *)((long)m + 8));
            CVar5 = CURLM_OK;
            Curl_trc_multi((Curl_easy *)d,"added to multi, mid=%u, running=%u, total=%u",
                           (ulong)uVar6,(ulong)uVar1,(ulong)uVar7);
          }
        }
        else {
          *(undefined8 *)((long)d + 0x68) = 0;
          Curl_uint_tbl_remove((uint_tbl *)((long)m + 8),*(uint *)((long)d + 0x10));
          *(undefined4 *)((long)d + 0x10) = 0xffffffff;
        }
      }
    }
  }
  return CVar5;
}

Assistant:

CURLMcode curl_multi_add_handle(CURLM *m, CURL *d)
{
  CURLMcode rc;
  struct Curl_multi *multi = m;
  struct Curl_easy *data = d;
  /* First, make some basic checks that the CURLM handle is a good handle */
  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* Verify that we got a somewhat good easy handle too */
  if(!GOOD_EASY_HANDLE(data))
    return CURLM_BAD_EASY_HANDLE;

  /* Prevent users from adding same easy handle more than once and prevent
     adding to more than one multi stack */
  if(data->multi)
    return CURLM_ADDED_ALREADY;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  if(multi->dead) {
    /* a "dead" handle cannot get added transfers while any existing easy
       handles are still alive - but if there are none alive anymore, it is
       fine to start over and unmark the "deadness" of this handle.
       This means only the admin handle MUST be present. */
    if((Curl_uint_tbl_count(&multi->xfers) != 1) ||
       !Curl_uint_tbl_contains(&multi->xfers, 0))
      return CURLM_ABORTED_BY_CALLBACK;
    multi->dead = FALSE;
    Curl_uint_bset_clear(&multi->process);
    Curl_uint_bset_clear(&multi->pending);
    Curl_uint_bset_clear(&multi->msgsent);
  }

  if(data->multi_easy) {
    /* if this easy handle was previously used for curl_easy_perform(), there
       is a private multi handle here that we can kill */
    curl_multi_cleanup(data->multi_easy);
    data->multi_easy = NULL;
  }

  /* Insert the easy into the multi->xfers table, assigning it a `mid`. */
  if(multi_xfers_add(multi, data))
    return CURLM_OUT_OF_MEMORY;

  /* Initialize timeout list for this handle */
  Curl_llist_init(&data->state.timeoutlist, NULL);

  /*
   * No failure allowed in this function beyond this point. No modification of
   * easy nor multi handle allowed before this except for potential multi's
   * connection pool growing which will not be undone in this function no
   * matter what.
   */
  if(data->set.errorbuffer)
    data->set.errorbuffer[0] = 0;

  data->state.os_errno = 0;

  /* make the Curl_easy refer back to this multi handle - before Curl_expire()
     is called. */
  data->multi = multi;

  /* Set the timeout for this handle to expire really soon so that it will
     be taken care of even when this handle is added in the midst of operation
     when only the curl_multi_socket() API is used. During that flow, only
     sockets that time-out or have actions will be dealt with. Since this
     handle has no action yet, we make sure it times out to get things to
     happen. */
  Curl_expire(data, 0, EXPIRE_RUN_NOW);

  rc = Curl_update_timer(multi);
  if(rc) {
    data->multi = NULL; /* not anymore */
    Curl_uint_tbl_remove(&multi->xfers, data->mid);
    data->mid = UINT_MAX;
    return rc;
  }

  /* set the easy handle */
  multistate(data, MSTATE_INIT);

#ifdef USE_LIBPSL
  /* Do the same for PSL. */
  if(data->share && (data->share->specifier & (1 << CURL_LOCK_DATA_PSL)))
    data->psl = &data->share->psl;
  else
    data->psl = &multi->psl;
#endif

  /* add the easy handle to the process set */
  Curl_uint_bset_add(&multi->process, data->mid);
  ++multi->xfers_alive;

  Curl_cpool_xfer_init(data);
  multi_warn_debug(multi, data);

  /* The admin handle only ever has default timeouts set. To improve the
     state somewhat we clone the timeouts from each added handle so that the
     admin handle always has the same timeouts as the most recently added
     easy handle. */
  multi->admin->set.timeout = data->set.timeout;
  multi->admin->set.server_response_timeout =
    data->set.server_response_timeout;
  multi->admin->set.no_signal = data->set.no_signal;

  CURL_TRC_M(data, "added to multi, mid=%u, running=%u, total=%u",
             data->mid, Curl_multi_xfers_running(multi),
             Curl_uint_tbl_count(&multi->xfers));
  return CURLM_OK;
}